

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stub.c
# Opt level: O0

int mmk_stub_create_static(mmk_stub *stub,char *target,mmk_fn fn,void *ctx)

{
  int iVar1;
  size_t sVar2;
  undefined1 *puVar3;
  long *in_FS_OFFSET;
  code *local_b8;
  code *local_b0;
  code *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  plt_offset *local_88;
  plt_offset *local_80;
  undefined8 local_78;
  undefined8 local_70;
  plt_offset *local_68;
  plt_offset *off;
  size_t nb_off;
  plt_lib lib;
  plt_ctx pctx;
  char *delim;
  char *path;
  char *name;
  void *ctx_local;
  mmk_fn fn_local;
  char *target_local;
  mmk_stub *stub_local;
  
  *(undefined4 *)(*in_FS_OFFSET + -0x20) = 0;
  *(undefined8 *)(*in_FS_OFFSET + -0x18) = 0;
  name = (char *)ctx;
  ctx_local = fn;
  fn_local = (mmk_fn)target;
  target_local = (char *)stub;
  sVar2 = mmk_strlen(target);
  path = (char *)mmk_malloc(sVar2 + 1);
  if (path == (char *)0x0) {
    stub_local._4_4_ = -0xc;
  }
  else {
    mmk_strcpy(path,(char *)fn_local);
    delim = (char *)0x0;
    pctx = (plt_ctx)mmk_strchr(path,0x40);
    if (pctx != (plt_ctx)0x0) {
      *(char *)&pctx->r_version = '\0';
      delim = (char *)((long)&pctx->r_version + 1);
    }
    if (delim != (char *)0x0) {
      iVar1 = mmk_streq(delim,"self");
      if (iVar1 != 0) {
        delim = (char *)0x0;
      }
    }
    lib = (plt_lib)mmk_plt_ctx();
    nb_off = (size_t)plt_get_lib((plt_ctx)lib,delim);
    if ((plt_lib)nb_off == (plt_lib)0x0) {
      stub_local._4_4_ = -2;
    }
    else {
      off = (plt_offset *)0x0;
      local_88 = plt_get_offsets((plt_ctx)lib,(plt_lib)nb_off,path,(size_t *)&off);
      if ((local_88 == (plt_offset *)0x0) || (off == (plt_offset *)0x0)) {
        stub_local._4_4_ = -2;
      }
      else {
        local_b8 = mmk_ctx_asked;
        local_b0 = mmk_set_ctx;
        local_a8 = mmk_ctx;
        local_a0 = name;
        local_98 = path;
        local_90 = delim;
        local_80 = off;
        local_78 = 0;
        local_70 = 0;
        local_68 = local_88;
        memcpy(target_local,&local_b8,0x50);
        puVar3 = create_trampoline(target_local,(undefined1 *)ctx_local);
        *(undefined1 **)(target_local + 0x40) = puVar3;
        plt_set_offsets(local_68,(size_t)off,*(undefined1 **)(target_local + 0x40));
        stub_local._4_4_ = 0;
      }
    }
  }
  return stub_local._4_4_;
}

Assistant:

int mmk_stub_create_static(struct mmk_stub *stub,
        const char *target, mmk_fn fn, void *ctx)
{
    tls_set(int, ask_ctx, 0);
    tls_set(struct mmk_stub *, mmk_ctx_, NULL);

    char *name = mmk_malloc(mmk_strlen(target) + 1);
    if (!name)
        return -ENOMEM;

    mmk_strcpy(name, target);

    char *path = NULL;
    char *delim = mmk_strchr(name, '@');
    if (delim != NULL) {
        *delim = 0;
        path = delim + 1;
    }
    if (path && mmk_streq(path, "self"))
        path = NULL;

    plt_ctx pctx = mmk_plt_ctx();
    plt_lib lib = plt_get_lib(pctx, path);
    if (!lib)
        return -ENOENT;

    size_t nb_off = 0;
    plt_offset *off = plt_get_offsets(pctx, lib, name, &nb_off);
    if (!off || !nb_off)
        return -ENOENT;

    *stub = (struct mmk_stub) {
        .ctx_asked = mmk_ctx_asked,
        .ctx_set = mmk_set_ctx,
        .ctx_get = mmk_ctx,
        .ctx = ctx,
        .name = name,
        .path = path,
        .offsets = off,
        .nb_offsets = nb_off,
    };
    stub->trampoline = create_trampoline(stub, (plt_fn *) fn);
    plt_set_offsets(off, nb_off, stub->trampoline);

    return 0;
}